

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O2

bool __thiscall
supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::contains
          (KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
          Key<1UL> *key)

{
  _Optional_payload_base<supermap::ByteArray<1UL>_> local_20;
  
  (*this->_vptr_KeyValueStorage[1])(&local_20,this,key);
  std::_Optional_payload_base<supermap::ByteArray<1UL>_>::_M_reset(&local_20);
  return local_20._M_engaged;
}

Assistant:

bool contains(const Key &key) {
        return getValue(key).has_value();
    }